

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,int radix)

{
  ulong uVar1;
  char local_34;
  int local_20;
  int tmp;
  int i;
  int radix_local;
  uint64 number_local;
  MinimalFormatter *this_local;
  
  local_20 = 0;
  _i = number;
  do {
    if (this->end_ <= this->cursor_ + local_20) break;
    uVar1 = _i % (ulong)(long)radix;
    _i = _i / (ulong)(long)radix;
    local_34 = (char)uVar1;
    if ((int)uVar1 < 10) {
      local_34 = local_34 + '0';
    }
    else {
      local_34 = local_34 + 'W';
    }
    this->cursor_[local_20] = local_34;
    local_20 = local_20 + 1;
  } while (_i != 0);
  std::reverse<char*>(this->cursor_,this->cursor_ + local_20);
  this->cursor_ = this->cursor_ + local_20;
  return;
}

Assistant:

void AppendUint64(uint64 number, int radix) {
    int i = 0;
    while (cursor_ + i < end_) {
      const int tmp = number % radix;
      number /= radix;
      cursor_[i] = (tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }